

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O0

void clonewiz(void)

{
  int iVar1;
  monst *mon;
  obj *obj;
  monst *mtmp2;
  
  mon = makemon(mons + 0x128,level,(int)u.ux,(int)u.uy,0);
  if (mon != (monst *)0x0) {
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffbfffff;
    mon->mtame = '\0';
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff7ffff;
    if ((u.uhave._0_1_ & 1) == 0) {
      iVar1 = rn2(2);
      if (iVar1 != 0) {
        obj = mksobj(level,0xd8,'\x01','\0');
        add_to_minv(mon,obj);
      }
    }
    mon->m_ap_type = '\x03';
    iVar1 = rn2(0xc);
    mon->mappearance = wizapp[iVar1];
    newsym((int)mon->mx,(int)mon->my);
  }
  return;
}

Assistant:

void clonewiz(void)
{
	struct monst *mtmp2;

	if ((mtmp2 = makemon(&mons[PM_WIZARD_OF_YENDOR], level,
				u.ux, u.uy, NO_MM_FLAGS)) != 0) {
	    mtmp2->msleeping = mtmp2->mtame = mtmp2->mpeaceful = 0;
	    if (!u.uhave.amulet && rn2(2)) {  /* give clone a fake */
		add_to_minv(mtmp2, mksobj(level, FAKE_AMULET_OF_YENDOR,
					TRUE, FALSE));
	    }
	    mtmp2->m_ap_type = M_AP_MONSTER;
	    mtmp2->mappearance = wizapp[rn2(SIZE(wizapp))];
	    newsym(mtmp2->mx,mtmp2->my);
	}
}